

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void BrotliStoreUncompressedMetaBlockHeader(size_t length,size_t *storage_ix,uint8_t *storage)

{
  ulong *puVar1;
  uint64_t local_138;
  uint64_t nibblesbits;
  size_t nlenbits;
  uint64_t lenbits;
  uint8_t *storage_local;
  size_t *storage_ix_local;
  size_t length_local;
  uint64_t v_3;
  uint8_t *p_3;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v_1;
  uint8_t *p_1;
  ulong local_78;
  uint64_t v;
  uint8_t *p;
  size_t *local_60;
  undefined8 local_58;
  undefined8 local_50;
  ulong local_48;
  ulong *local_40;
  
  local_50 = 1;
  local_58 = 0;
  v = (uint64_t)(storage + (*storage_ix >> 3));
  local_78 = 0L << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)v;
  *(ulong *)v = local_78;
  *storage_ix = *storage_ix + 1;
  lenbits = (uint64_t)storage;
  storage_local = (uint8_t *)storage_ix;
  storage_ix_local = (size_t *)length;
  p = storage;
  local_60 = storage_ix;
  local_48 = local_78;
  local_40 = (ulong *)v;
  BrotliEncodeMlen(length,&nlenbits,&nibblesbits,&local_138);
  puVar1 = (ulong *)(lenbits + (*(ulong *)storage_local >> 3));
  *puVar1 = local_138 << ((byte)*(undefined8 *)storage_local & 7) | (ulong)(byte)*puVar1;
  *(long *)storage_local = *(long *)storage_local + 2;
  puVar1 = (ulong *)(lenbits + (*(ulong *)storage_local >> 3));
  *puVar1 = nlenbits << ((byte)*(undefined8 *)storage_local & 7) | (ulong)(byte)*puVar1;
  *(uint64_t *)storage_local = nibblesbits + *(long *)storage_local;
  puVar1 = (ulong *)(lenbits + (*(ulong *)storage_local >> 3));
  *puVar1 = 1L << ((byte)*(undefined8 *)storage_local & 7) | (ulong)(byte)*puVar1;
  *(long *)storage_local = *(long *)storage_local + 1;
  return;
}

Assistant:

static void BrotliStoreUncompressedMetaBlockHeader(size_t length,
                                                   size_t* storage_ix,
                                                   uint8_t* storage) {
  uint64_t lenbits;
  size_t nlenbits;
  uint64_t nibblesbits;

  /* Write ISLAST bit.
     Uncompressed block cannot be the last one, so set to 0. */
  BrotliWriteBits(1, 0, storage_ix, storage);
  BrotliEncodeMlen(length, &lenbits, &nlenbits, &nibblesbits);
  BrotliWriteBits(2, nibblesbits, storage_ix, storage);
  BrotliWriteBits(nlenbits, lenbits, storage_ix, storage);
  /* Write ISUNCOMPRESSED bit. */
  BrotliWriteBits(1, 1, storage_ix, storage);
}